

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::handleFunctionCall
          (HlslParseContext *this,TSourceLoc *loc,TFunction *function,TIntermTyped *arguments)

{
  pointer pbVar1;
  pointer ppTVar2;
  TIntermediate *pTVar3;
  iterator iVar4;
  TString name;
  TString structName;
  TIntermTyped *pTVar5;
  TIntermTyped *arguments_00;
  bool bVar6;
  char cVar7;
  TOperator TVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  long *plVar11;
  long lVar12;
  undefined4 extraout_var_01;
  HlslParseContext *pHVar13;
  undefined4 extraout_var_02;
  TType *pTVar14;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TFunction *function_00;
  undefined4 extraout_var_05;
  TIntermSymbol *front;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TSymbol *pTVar15;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>> *this_00;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  TOperator op;
  uint uVar16;
  char *__end;
  undefined1 auStack_1a8 [15];
  bool builtIn;
  TIntermTyped *result;
  TIntermTyped *arguments_local;
  undefined4 uStack_188;
  int thisDepth;
  HlslParseContext *local_180;
  TSourceLoc *local_178;
  TIntermTyped *local_170;
  TString mangle;
  TStorageQualifier qual;
  pointer local_138;
  TPoolAllocator *local_118;
  undefined1 *local_110;
  undefined1 local_100 [16];
  TPoolAllocator *local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [16];
  TType type;
  undefined4 extraout_var_00;
  
  result = (TIntermTyped *)0x0;
  arguments_local = arguments;
  TVar8 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
  if (TVar8 != EOpNull) {
    TType::TType(&type,EbtVoid,EvqTemporary,1,0,0,false);
    bVar6 = constructorError(this,loc,&arguments->super_TIntermNode,function,TVar8,&type);
    if ((!bVar6) &&
       (result = handleConstructor(this,loc,arguments,&type), result == (TIntermTyped *)0x0)) {
      local_118 = GetThreadPoolAllocator();
      local_110 = local_100;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_118,"","");
      local_f0 = GetThreadPoolAllocator();
      local_e8 = local_d8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_f0,"","");
      name._M_dataplus._M_p = (pointer)&local_f0;
      name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_118;
      name._16_15_ = auStack_1a8;
      name.field_2._M_local_buf[7] = builtIn;
      name.field_2._8_8_ = result;
      structName._M_dataplus._M_p._0_4_ = uStack_188;
      structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)arguments_local;
      structName._M_dataplus._M_p._4_4_ = thisDepth;
      structName._M_string_length = (size_type)local_180;
      structName.field_2._M_allocated_capacity = (size_type)local_178;
      structName.field_2._8_8_ = local_170;
      TType::getCompleteString(&mangle,&type,false,true,true,true,name,structName);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"cannot construct with these arguments",mangle._M_dataplus._M_p,"");
      return (TIntermTyped *)0x0;
    }
    goto LAB_00410197;
  }
  builtIn = false;
  thisDepth = 0;
  iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  CONCAT44(extraout_var,iVar9),"mul");
  if (iVar9 == 0) {
    addGenMulArgumentConversion(this,loc,function,&arguments_local);
  }
  local_180 = this;
  if (arguments == (TIntermTyped *)0x0) {
LAB_0040fd76:
    function_00 = (TFunction *)0x0;
  }
  else {
    iVar9 = (*(arguments->super_TIntermNode)._vptr_TIntermNode[6])(arguments);
    plVar11 = (long *)CONCAT44(extraout_var_00,iVar9);
    if (((plVar11 == (long *)0x0) ||
        (lVar12 = (**(code **)(*plVar11 + 400))(plVar11),
        *(long *)(lVar12 + 0x10) == *(long *)(lVar12 + 8))) ||
       (lVar12 = (**(code **)(*plVar11 + 400))(plVar11), **(long **)(lVar12 + 8) == 0)) {
      iVar9 = (*(arguments->super_TIntermNode)._vptr_TIntermNode[0xc])(arguments);
      lVar12 = 0x60;
      if (CONCAT44(extraout_var_01,iVar9) != 0) goto LAB_0040fcfd;
      pHVar13 = (HlslParseContext *)0x0;
    }
    else {
      lVar12 = (**(code **)(*plVar11 + 400))(plVar11);
      arguments = (TIntermTyped *)**(undefined8 **)(lVar12 + 8);
      lVar12 = 0x18;
LAB_0040fcfd:
      pHVar13 = (HlslParseContext *)
                (**(code **)((long)(arguments->super_TIntermNode)._vptr_TIntermNode + lVar12))
                          (arguments);
    }
    if (pHVar13 == (HlslParseContext *)0x0) goto LAB_0040fd76;
    iVar9 = (*(pHVar13->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])();
    pTVar14 = getStructBufferContentType(pHVar13,(TType *)CONCAT44(extraout_var_02,iVar9));
    if (pTVar14 == (TType *)0x0) goto LAB_0040fd76;
    iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    if (*(ulong *)(CONCAT44(extraout_var_03,iVar9) + 0x10) < 6) {
      bVar6 = false;
    }
    else {
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      pHVar13 = (HlslParseContext *)&type;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      substr((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)&type,
             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             CONCAT44(extraout_var_04,iVar9),5,0xffffffffffffffff);
      bVar6 = isStructBufferMethod(pHVar13,(TString *)&type);
    }
    if (bVar6 == false) {
      function_00 = (TFunction *)0x0;
      this = local_180;
    }
    else {
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      mangle._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      lVar12 = *(long *)(CONCAT44(extraout_var_12,iVar9) + 8);
      mangle._M_dataplus._M_p = (pointer)&mangle.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&mangle,lVar12,*(long *)(CONCAT44(extraout_var_12,iVar9) + 0x10) + lVar12
                         );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&mangle,"(");
      this = local_180;
      function_00 = (TFunction *)0x0;
      pTVar15 = TSymbolTable::find((local_180->super_TParseContextBase).symbolTable,&mangle,&builtIn
                                   ,(bool *)0x0,(int *)0x0);
      if (pTVar15 != (TSymbol *)0x0) {
        iVar9 = (*pTVar15->_vptr_TSymbol[7])(pTVar15);
        function_00 = (TFunction *)CONCAT44(extraout_var_13,iVar9);
      }
    }
  }
  if (function_00 == (TFunction *)0x0) {
    function_00 = findFunction(this,loc,function,&builtIn,&thisDepth,&arguments_local);
  }
  if (function_00 != (TFunction *)0x0) {
    mangle._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    mangle._M_string_length = 0;
    mangle.field_2._M_local_buf[0] = '\0';
    mangle._M_dataplus._M_p = (pointer)&mangle.field_2;
    if ((long)thisDepth == 0) {
      iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&mangle,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_06,iVar9));
    }
    else {
      pbVar1 = (this->currentTypePrefix).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&mangle,pbVar1 + (((ulong)((long)(this->currentTypePrefix).
                                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                                 .
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)pbVar1) >> 3) * -0x3333333333333333 -
                                 (long)thisDepth));
      iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[6])(function_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(&mangle,*(char **)(CONCAT44(extraout_var_05,iVar9) + 8),
                *(size_type *)(CONCAT44(extraout_var_05,iVar9) + 0x10));
      ppTVar2 = (this->implicitThisStack).
                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>.
                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      front = TIntermediate::addSymbol
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                         ppTVar2[((ulong)((long)(this->implicitThisStack).
                                                super_vector<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                                .
                                                super__Vector_base<glslang::TVariable_*,_glslang::pool_allocator<glslang::TVariable_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)ppTVar2) >> 3) - (long)thisDepth]);
      pushFrontArguments(this,&front->super_TIntermTyped,&arguments_local);
    }
    if (arguments_local != (TIntermTyped *)0x0) {
      addInputArgumentConversions(this,function_00,&arguments_local);
    }
    if ((arguments_local != (TIntermTyped *)0x0) && (builtIn == false)) {
      expandArguments(this,loc,function_00,&arguments_local);
    }
    if (arguments_local != (TIntermTyped *)0x0) {
      (*(arguments_local->super_TIntermNode)._vptr_TIntermNode[6])();
    }
    TVar8 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x1b])(function_00);
    pTVar5 = arguments_local;
    local_178 = loc;
    if ((TVar8 == EOpNull) || (builtIn == false)) {
      pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
      result = TIntermediate::setAggregateOperator
                         (pTVar3,&pTVar5->super_TIntermNode,EOpFunctionCall,
                          (TType *)CONCAT44(extraout_var_10,iVar9),loc);
      iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
      plVar11 = (long *)CONCAT44(extraout_var_11,iVar9);
      (**(code **)(*plVar11 + 0x1a0))(plVar11,&mangle);
      if (builtIn == false) {
        (**(code **)(*plVar11 + 0x1b0))(plVar11);
        TIntermediate::addToCallGraph
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   (this->super_TParseContextBase).super_TParseVersions.infoSink,
                   &this->currentCaller,&mangle);
      }
    }
    else {
      op = EOpRoundEven;
      if (TVar8 != EOpRound ||
          ((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgHlslDX9Compatible)
          != EShMsgDefault) {
        op = TVar8;
      }
      pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
      pTVar5 = arguments_local;
      iVar10 = (*(function_00->super_TSymbol)._vptr_TSymbol[0xc])(function_00);
      result = TIntermediate::addBuiltInFunctionCall
                         (pTVar3,loc,op,iVar9 == 1,&pTVar5->super_TIntermNode,
                          (TType *)CONCAT44(extraout_var_07,iVar10));
      pTVar5 = arguments_local;
      if (result == (TIntermTyped *)0x0) {
        iVar9 = (**(arguments_local->super_TIntermNode)._vptr_TIntermNode)(arguments_local);
        TIntermTyped::getCompleteString_abi_cxx11_((TString *)&qual,pTVar5,false);
        this = local_180;
        (*(local_180->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (local_180,CONCAT44(extraout_var_14,iVar9)," wrong operand type","Internal Error",
                   "built in unary operator function.  Type: %s",local_138);
        loc = local_178;
      }
      else {
        iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[4])(result);
        loc = local_178;
        this = local_180;
        if (CONCAT44(extraout_var_08,iVar9) != 0) {
          iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[4])();
          builtInOpCheck(this,loc,function_00,(TIntermOperator *)CONCAT44(extraout_var_09,iVar9));
        }
      }
    }
    arguments_00 = arguments_local;
    pTVar5 = result;
    decomposeStructBufferMethods(this,loc,&result,&arguments_local->super_TIntermNode);
    decomposeIntrinsic(this,loc,&result,&arguments_00->super_TIntermNode);
    decomposeSampleMethods(this,loc,&result,&arguments_00->super_TIntermNode);
    decomposeGeometryMethods(this,loc,&result,&arguments_00->super_TIntermNode);
    local_170 = pTVar5;
    if ((result == pTVar5) &&
       (iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(),
       CONCAT44(extraout_var_17,iVar9) != 0)) {
      iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])();
      this_00 = (vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
                 *)(**(code **)(*(long *)CONCAT44(extraout_var_18,iVar9) + 0x1c0))
                             ((long *)CONCAT44(extraout_var_18,iVar9));
      iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
      if (0 < iVar9) {
        uVar16 = 0;
        do {
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar16);
          lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_19,iVar9) + 8) + 0x50))();
          qual = *(TStorageQualifier *)(lVar12 + 8) & 0x7f;
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar16);
          lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_20,iVar9) + 8) + 0x58))();
          if ((*(uint *)(lVar12 + 8) & 0x1fe0000) == 0x960000) {
            iVar4._M_current = *(TStorageQualifier **)(this_00 + 0x10);
            if (iVar4._M_current == *(TStorageQualifier **)(this_00 + 0x18)) {
              std::
              vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
              ::_M_realloc_insert<glslang::TStorageQualifier_const&>(this_00,iVar4,&qual);
            }
            else {
              *iVar4._M_current = qual;
              *(TStorageQualifier **)(this_00 + 0x10) = iVar4._M_current + 1;
            }
LAB_0041036a:
            iVar4._M_current = *(TStorageQualifier **)(this_00 + 0x10);
            if (iVar4._M_current == *(TStorageQualifier **)(this_00 + 0x18)) {
              std::
              vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
              ::_M_realloc_insert<glslang::TStorageQualifier_const&>(this_00,iVar4,&qual);
            }
            else {
              *iVar4._M_current = qual;
              *(TStorageQualifier **)(this_00 + 0x10) = iVar4._M_current + 1;
            }
          }
          else {
            iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar16);
            pTVar14 = *(TType **)(CONCAT44(extraout_var_21,iVar9) + 8);
            iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar16);
            lVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_22,iVar9) + 8) + 0x50))();
            bVar6 = shouldFlatten(this,pTVar14,*(TStorageQualifier *)(lVar12 + 8) & 0x7f,true);
            if (!bVar6) goto LAB_0041036a;
            iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])(function_00,(ulong)uVar16);
            plVar11 = *(long **)(CONCAT44(extraout_var_23,iVar9) + 8);
            cVar7 = (**(code **)(*plVar11 + 0x128))(plVar11);
            if (cVar7 == '\0') {
LAB_004103b2:
              __assert_fail("isStruct()",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                            ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
            }
            iVar9 = -1;
            while (iVar9 = iVar9 + 1,
                  iVar9 < (int)((ulong)(*(long *)(plVar11[0xd] + 0x10) - *(long *)(plVar11[0xd] + 8)
                                       ) >> 5)) {
              iVar4._M_current = *(TStorageQualifier **)(this_00 + 0x10);
              if (iVar4._M_current == *(TStorageQualifier **)(this_00 + 0x18)) {
                std::
                vector<glslang::TStorageQualifier,glslang::pool_allocator<glslang::TStorageQualifier>>
                ::_M_realloc_insert<glslang::TStorageQualifier_const&>(this_00,iVar4,&qual);
              }
              else {
                *iVar4._M_current = qual;
                *(TStorageQualifier **)(this_00 + 0x10) = iVar4._M_current + 1;
              }
              iVar10 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x28])
                                 (function_00,(ulong)uVar16);
              plVar11 = *(long **)(CONCAT44(extraout_var_24,iVar10) + 8);
              cVar7 = (**(code **)(*plVar11 + 0x128))(plVar11);
              if (cVar7 == '\0') goto LAB_004103b2;
            }
          }
          uVar16 = uVar16 + 1;
          iVar9 = (*(function_00->super_TSymbol)._vptr_TSymbol[0x24])(function_00);
          this = local_180;
        } while ((int)uVar16 < iVar9);
      }
    }
    loc = local_178;
    if ((result == local_170) &&
       (iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(), loc = local_178,
       CONCAT44(extraout_var_15,iVar9) != 0)) {
      iVar9 = (*(result->super_TIntermNode)._vptr_TIntermNode[4])();
      result = addOutputArgumentConversions
                         (this,function_00,(TIntermOperator *)CONCAT44(extraout_var_16,iVar9));
      loc = local_178;
    }
  }
LAB_00410197:
  if (result == (TIntermTyped *)0x0) {
    result = &TIntermediate::addConstantUnion
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,0.0,
                         EbtFloat,loc,false)->super_TIntermTyped;
  }
  return &((TIntermConstantUnion *)result)->super_TIntermTyped;
}

Assistant:

TIntermTyped* HlslParseContext::handleFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermTyped* arguments)
{
    TIntermTyped* result = nullptr;

    TOperator op = function->getBuiltInOp();
    if (op != EOpNull) {
        //
        // Then this should be a constructor.
        // Don't go through the symbol table for constructors.
        // Their parameters will be verified algorithmically.
        //
        TType type(EbtVoid);  // use this to get the type back
        if (! constructorError(loc, arguments, *function, op, type)) {
            //
            // It's a constructor, of type 'type'.
            //
            result = handleConstructor(loc, arguments, type);
            if (result == nullptr) {
                error(loc, "cannot construct with these arguments", type.getCompleteString().c_str(), "");
                return nullptr;
            }
        }
    } else {
        //
        // Find it in the symbol table.
        //
        const TFunction* fnCandidate = nullptr;
        bool builtIn = false;
        int thisDepth = 0;

        // For mat mul, the situation is unusual: we have to compare vector sizes to mat row or col sizes,
        // and clamp the opposite arg.  Since that's complex, we farm it off to a separate method.
        // It doesn't naturally fall out of processing an argument at a time in isolation.
        if (function->getName() == "mul")
            addGenMulArgumentConversion(loc, *function, arguments);

        TIntermAggregate* aggregate = arguments ? arguments->getAsAggregate() : nullptr;

        // TODO: this needs improvement: there's no way at present to look up a signature in
        // the symbol table for an arbitrary type.  This is a temporary hack until that ability exists.
        // It will have false positives, since it doesn't check arg counts or types.
        if (arguments) {
            // Check if first argument is struct buffer type.  It may be an aggregate or a symbol, so we
            // look for either case.

            TIntermTyped* arg0 = nullptr;

            if (aggregate && aggregate->getSequence().size() > 0 && aggregate->getSequence()[0])
                arg0 = aggregate->getSequence()[0]->getAsTyped();
            else if (arguments->getAsSymbolNode())
                arg0 = arguments->getAsSymbolNode();

            if (arg0 != nullptr && isStructBufferType(arg0->getType())) {
                static const int methodPrefixSize = sizeof(BUILTIN_PREFIX)-1;

                if (function->getName().length() > methodPrefixSize &&
                    isStructBufferMethod(function->getName().substr(methodPrefixSize))) {
                    const TString mangle = function->getName() + "(";
                    TSymbol* symbol = symbolTable.find(mangle, &builtIn);

                    if (symbol)
                        fnCandidate = symbol->getAsFunction();
                }
            }
        }

        if (fnCandidate == nullptr)
            fnCandidate = findFunction(loc, *function, builtIn, thisDepth, arguments);

        if (fnCandidate) {
            // This is a declared function that might map to
            //  - a built-in operator,
            //  - a built-in function not mapped to an operator, or
            //  - a user function.

            // turn an implicit member-function resolution into an explicit call
            TString callerName;
            if (thisDepth == 0)
                callerName = fnCandidate->getMangledName();
            else {
                // get the explicit (full) name of the function
                callerName = currentTypePrefix[currentTypePrefix.size() - thisDepth];
                callerName += fnCandidate->getMangledName();
                // insert the implicit calling argument
                pushFrontArguments(intermediate.addSymbol(*getImplicitThis(thisDepth)), arguments);
            }

            // Convert 'in' arguments, so that types match.
            // However, skip those that need expansion, that is covered next.
            if (arguments)
                addInputArgumentConversions(*fnCandidate, arguments);

            // Expand arguments.  Some arguments must physically expand to a different set
            // than what the shader declared and passes.
            if (arguments && !builtIn)
                expandArguments(loc, *fnCandidate, arguments);

            // Expansion may have changed the form of arguments
            aggregate = arguments ? arguments->getAsAggregate() : nullptr;

            op = fnCandidate->getBuiltInOp();
            if (builtIn && op != EOpNull) {
                // SM 4.0 and above guarantees roundEven semantics for round()
                if (!hlslDX9Compatible() && op == EOpRound)
                    op = EOpRoundEven;

                // A function call mapped to a built-in operation.
                result = intermediate.addBuiltInFunctionCall(loc, op, fnCandidate->getParamCount() == 1, arguments,
                                                             fnCandidate->getType());
                if (result == nullptr)  {
                    error(arguments->getLoc(), " wrong operand type", "Internal Error",
                        "built in unary operator function.  Type: %s",
                        static_cast<TIntermTyped*>(arguments)->getCompleteString().c_str());
                } else if (result->getAsOperator()) {
                    builtInOpCheck(loc, *fnCandidate, *result->getAsOperator());
                }
            } else {
                // This is a function call not mapped to built-in operator.
                // It could still be a built-in function, but only if PureOperatorBuiltins == false.
                result = intermediate.setAggregateOperator(arguments, EOpFunctionCall, fnCandidate->getType(), loc);
                TIntermAggregate* call = result->getAsAggregate();
                call->setName(callerName);

                // this is how we know whether the given function is a built-in function or a user-defined function
                // if builtIn == false, it's a userDefined -> could be an overloaded built-in function also
                // if builtIn == true, it's definitely a built-in function with EOpNull
                if (! builtIn) {
                    call->setUserDefined();
                    intermediate.addToCallGraph(infoSink, currentCaller, callerName);
                }
            }

            // for decompositions, since we want to operate on the function node, not the aggregate holding
            // output conversions.
            const TIntermTyped* fnNode = result;

            decomposeStructBufferMethods(loc, result, arguments); // HLSL->AST struct buffer method decompositions
            decomposeIntrinsic(loc, result, arguments);           // HLSL->AST intrinsic decompositions
            decomposeSampleMethods(loc, result, arguments);       // HLSL->AST sample method decompositions
            decomposeGeometryMethods(loc, result, arguments);     // HLSL->AST geometry method decompositions

            // Create the qualifier list, carried in the AST for the call.
            // Because some arguments expand to multiple arguments, the qualifier list will
            // be longer than the formal parameter list.
            if (result == fnNode && result->getAsAggregate()) {
                TQualifierList& qualifierList = result->getAsAggregate()->getQualifierList();
                for (int i = 0; i < fnCandidate->getParamCount(); ++i) {
                    TStorageQualifier qual = (*fnCandidate)[i].type->getQualifier().storage;
                    if (hasStructBuffCounter(*(*fnCandidate)[i].type)) {
                        // add buffer and counter buffer argument qualifier
                        qualifierList.push_back(qual);
                        qualifierList.push_back(qual);
                    } else if (shouldFlatten(*(*fnCandidate)[i].type, (*fnCandidate)[i].type->getQualifier().storage,
                                             true)) {
                        // add structure member expansion
                        for (int memb = 0; memb < (int)(*fnCandidate)[i].type->getStruct()->size(); ++memb)
                            qualifierList.push_back(qual);
                    } else {
                        // Normal 1:1 case
                        qualifierList.push_back(qual);
                    }
                }
            }

            // Convert 'out' arguments.  If it was a constant folded built-in, it won't be an aggregate anymore.
            // Built-ins with a single argument aren't called with an aggregate, but they also don't have an output.
            // Also, build the qualifier list for user function calls, which are always called with an aggregate.
            // We don't do this is if there has been a decomposition, which will have added its own conversions
            // for output parameters.
            if (result == fnNode && result->getAsAggregate())
                result = addOutputArgumentConversions(*fnCandidate, *result->getAsOperator());
        }
    }

    // generic error recovery
    // TODO: simplification: localize all the error recoveries that look like this, and taking type into account to
    //       reduce cascades
    if (result == nullptr)
        result = intermediate.addConstantUnion(0.0, EbtFloat, loc);

    return result;
}